

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

void icu_63::MessageImpl::appendReducedApostrophes
               (UnicodeString *s,int32_t start,int32_t limit,UnicodeString *sb)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  int start_00;
  int iVar4;
  UChar local_3a;
  UnicodeString *local_38;
  
  iVar4 = -1;
  local_38 = sb;
  do {
    start_00 = 0;
    if (-1 < start) {
      sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        start_00 = (s->fUnion).fFields.fLength;
      }
      else {
        start_00 = (int)sVar1 >> 5;
      }
      if (start <= start_00) {
        start_00 = start;
      }
    }
    sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (s->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    iVar2 = UnicodeString::doIndexOf(s,L'\'',start_00,iVar3 - start_00);
    if (iVar2 < limit && -1 < iVar2) {
      if (iVar2 == iVar4) {
        local_3a = L'\'';
        UnicodeString::doAppend(local_38,&local_3a,0,1);
        start = start + 1;
        iVar4 = -1;
      }
      else {
        UnicodeString::doAppend(local_38,s,start,iVar2 - start);
        start = iVar2 + 1;
        iVar4 = start;
      }
    }
    else {
      UnicodeString::doAppend(local_38,s,start,limit - start);
    }
  } while (iVar2 < limit && -1 < iVar2);
  return;
}

Assistant:

void
MessageImpl::appendReducedApostrophes(const UnicodeString &s, int32_t start, int32_t limit,
                                      UnicodeString &sb) {
    int32_t doubleApos=-1;
    for(;;) {
        int32_t i=s.indexOf(u_apos, start);
        if(i<0 || i>=limit) {
            sb.append(s, start, limit-start);
            break;
        }
        if(i==doubleApos) {
            // Double apostrophe at start-1 and start==i, append one.
            sb.append(u_apos);
            ++start;
            doubleApos=-1;
        } else {
            // Append text between apostrophes and skip this one.
            sb.append(s, start, i-start);
            doubleApos=start=i+1;
        }
    }
}